

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall llm_tokenizer_ugm::~llm_tokenizer_ugm(llm_tokenizer_ugm *this)

{
  (this->super_llm_tokenizer)._vptr_llm_tokenizer = (_func_int **)&PTR__llm_tokenizer_ugm_002ce360;
  llama_vocab::std::
  _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
  ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
               *)&this->token_matcher);
  llama_vocab::std::
  _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
  ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
               *)&this->user_defined_token_matcher);
  std::__cxx11::string::~string((string *)&this->escaped_space);
  return;
}

Assistant:

llm_tokenizer_ugm(const llama_vocab & vocab, const std::vector<char> & precompiled_charsmap) {
        if (precompiled_charsmap.size() > 0) {
            size_t charsmap_offset = 0;

            // First four bytes of precompiled_charsmap contains length of binary
            // blob containing XOR-compressed compact double array (XCDA) entries
            uint32_t xcda_blob_size = *(const uint32_t *) &precompiled_charsmap[0];
            charsmap_offset += sizeof(xcda_blob_size);
            if (xcda_blob_size + charsmap_offset >= precompiled_charsmap.size()) {
                throw std::runtime_error("Index out of array bounds in precompiled charsmap!");
            }

            // Next xcda_blob_size bytes contain entries of XOR-compressed compact
            // double array (XCDA). Each entry is bit-packed into a 32-bit integer.
            xcda_array = (const uint32_t *) &precompiled_charsmap[charsmap_offset];
            xcda_array_size = xcda_blob_size / sizeof(uint32_t);
            charsmap_offset += xcda_blob_size;

            // Remaining bytes of precompiled charsmap contain null-terminated
            // replacement strings for prefixes matched by the XCDA.
            prefix_replacements = &precompiled_charsmap[charsmap_offset];
            prefix_replacements_size = precompiled_charsmap.size() - charsmap_offset;
        }

        for (uint32_t id = 0; id < vocab.n_tokens(); ++id) {
            const auto & token_data = vocab.get_token_data(id);

            if (vocab.is_normal(id)) {
                min_score = std::min<float>(min_score, token_data.score);
                max_score = std::max<float>(max_score, token_data.score);
            }

            if (vocab.is_normal(id) ||
                vocab.is_user_defined(id) ||
                vocab.is_unused(id)) {
                token_matcher.insert(token_data.text.data(), token_data.text.size(), id);
            }

            if (vocab.is_user_defined(id)) {
                user_defined_token_matcher.insert(token_data.text.data(), token_data.text.size());
            }
        }

        unknown_token_score = min_score - unknown_token_score_penalty;
    }